

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_startChunkedReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  TadsHttpServerThread *this_00;
  int iVar1;
  vm_httpreq_ext *pvVar2;
  char *pcVar3;
  ssize_t sVar4;
  uint *in_RCX;
  void **__n;
  size_t __n_00;
  vm_val_t *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  vm_val_t *in_RDI;
  int in_R8D;
  char hbuf [256];
  TadsServerThread *t;
  vm_val_t *headers;
  char *status;
  size_t status_len;
  size_t cont_type_len;
  char *cont_type;
  TadsHttpRequest *req;
  uint argc;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  uint *in_stack_fffffffffffffe70;
  TadsHttpServerThread *t_00;
  undefined4 in_stack_fffffffffffffe78;
  uint uVar5;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  vm_val_t *in_stack_fffffffffffffe98;
  TadsServerThread *in_stack_fffffffffffffea0;
  vm_val_t *local_70;
  void *local_60;
  size_t local_58;
  char *local_50;
  TadsHttpRequest *local_48;
  uint local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (uint *)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = *in_RCX;
  }
  local_2c = uVar5;
  local_20 = in_RDX;
  if ((getp_startChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_startChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::
                                   desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_startChunkedReply::desc,1,3);
    __cxa_guard_release(&getp_startChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(uVar5,in_stack_fffffffffffffe78),in_stack_fffffffffffffe70
                     ,(CVmNativeCodeDesc *)
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (iVar1 == 0) {
    pvVar2 = get_ext((CVmObjHTTPRequest *)in_RDI);
    local_48 = pvVar2->req;
    if ((local_48->super_TadsEventMessage).super_TadsMessage.completed != 0) {
      throw_net_err((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    }
    CVmStack::get(0);
    local_50 = vm_val_t::get_as_string
                         ((vm_val_t *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    if (local_50 == (char *)0x0) {
      err_throw(0);
    }
    local_58 = vmb_get_len((char *)0x255f01);
    local_50 = local_50 + 2;
    __n = &local_60;
    pcVar3 = get_status_arg(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                            (int)((ulong)in_RDI >> 0x20),
                            (size_t *)CONCAT44(uVar5,in_stack_fffffffffffffe78));
    local_70 = (vm_val_t *)0x0;
    __buf = extraout_RDX;
    if (2 < local_2c) {
      local_70 = CVmStack::get(2);
      iVar1 = vm_val_t::is_listlike(in_RDI);
      __buf = extraout_RDX_00;
      if (iVar1 == 0) {
        err_throw(0);
      }
    }
    this_00 = local_48->thread;
    sVar4 = TadsServerThread::send
                      (&this_00->super_TadsServerThread,0x3a93e6,__buf,(size_t)__n,in_R8D);
    if ((((int)sVar4 == 0) ||
        (sVar4 = TadsServerThread::send
                           (&this_00->super_TadsServerThread,(int)pcVar3,local_60,(size_t)__n,in_R8D
                           ), (int)sVar4 == 0)) ||
       (sVar4 = TadsServerThread::send
                          (&this_00->super_TadsServerThread,0x3a9435,__buf_00,(size_t)__n,in_R8D),
       (int)sVar4 == 0)) {
      TadsServerThread::last_error((TadsServerThread *)0x255ffb);
      throw_net_err((char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
    }
    if (local_70 != (vm_val_t *)0x0) {
      send_custom_headers(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    t_00 = this_00;
    get_ext((CVmObjHTTPRequest *)in_RDI);
    send_cookies(&t_00->super_TadsServerThread,
                 (vm_httpreq_cookie *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    __n_00 = local_58 & 0xffffffff;
    pcVar3 = local_50;
    t3sprintf(&stack0xfffffffffffffe88,0x100,
              "Content-Type: %.*s\r\nTransfer-Encoding: chunked\r\n\r\n");
    sVar4 = TadsServerThread::send
                      (&this_00->super_TadsServerThread,(int)&stack0xfffffffffffffe88,__buf_01,
                       __n_00,(int)pcVar3);
    if ((int)sVar4 == 0) {
      TadsServerThread::last_error((TadsServerThread *)0x25609c);
      throw_net_err((char *)t_00,in_stack_fffffffffffffe6c);
    }
    CVmStack::discard(local_2c);
    vm_val_t::set_nil(local_20);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_startChunkedReply(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request */
    TadsHttpRequest *req = get_ext()->req;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* get the content type argument */
    const char *cont_type = G_stk->get(0)->get_as_string(vmg0_);
    if (cont_type == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the length and buffer pointer */
    size_t cont_type_len = vmb_get_len(cont_type);
    cont_type += VMB_LEN;

    /* get the result code, if present */
    size_t status_len;
    const char *status = get_status_arg(vmg_ 0, 1, argc, status_len);

    /* get the headers argument */
    const vm_val_t *headers = 0;
    if (argc >= 3)
    {
        /* get the headers value */
        headers = G_stk->get(2);

        /* make sure it's a list */
        if (!headers->is_listlike(vmg0_))
            err_throw(VMERR_LIST_VAL_REQD);
    }

    /*
     *   Send the headers, starting with the status code 
     */
    TadsServerThread *t = req->thread;
    if (!t->send("HTTP/1.1 ")
        || !t->send(status, status_len)
        || !t->send("\r\n"))
        throw_net_err(vmg_ "error sending status", t->last_error());

    /* send the custom headers, if any */
    if (headers != 0)
        send_custom_headers(vmg_ t, headers);

    /* send the cookies, if any */
    send_cookies(vmg_ t, get_ext()->cookies);

    /* send the standard headers: Content-Type, Transfer-Encoding */
    char hbuf[256];
    t3sprintf(hbuf, sizeof(hbuf),
              "Content-Type: %.*s\r\n"
              "Transfer-Encoding: chunked\r\n"
              "\r\n",
              (int)cont_type_len, cont_type);
    if (!t->send(hbuf))
        throw_net_err(vmg_ "error sending headers", t->last_error());

    /* discard arguments */
    G_stk->discard(argc);

    /* no result */
    retval->set_nil();

    /* handled */
    return TRUE;
}